

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

int struct_size_IOfield(FMContext fmc,FMFieldList list)

{
  int iVar1;
  long in_RAX;
  int field;
  int iVar2;
  int *piVar3;
  long elements;
  
  field = 0;
  iVar2 = 0;
  elements = in_RAX;
  for (piVar3 = &list->field_offset; ((_FMField *)(piVar3 + -5))->field_name != (char *)0x0;
      piVar3 = piVar3 + 6) {
    iVar1 = is_var_array_field(list,field);
    if (iVar1 == 0) {
      if (fmc == (FMContext)0x0) {
        iVar1 = piVar3[-1];
      }
      else {
        FMarray_str_to_data_type(*(char **)(piVar3 + -3),&elements);
        iVar1 = piVar3[-1] * (int)elements;
      }
    }
    else {
      iVar1 = 8;
      if ((fmc != (FMContext)0x0) &&
         (iVar1 = fmc->native_pointer_size, fmc->native_pointer_size == 0)) {
        iVar1 = 8;
      }
    }
    if (iVar2 <= iVar1 + *piVar3) {
      iVar2 = iVar1 + *piVar3;
    }
    field = field + 1;
  }
  return iVar2;
}

Assistant:

extern
int
struct_size_IOfield(FMContext fmc, FMFieldList list)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if (is_var_array_field(list, i) == 1) {
	    /* variant array, real_field_size is fmformat->pointer_size */
	    if ((fmc == NULL) || (fmc->native_pointer_size == 0)) {
		field_size = sizeof(char *);
	    } else {
		field_size = fmc->native_pointer_size;
	    }
	} else {
	    if (fmc) {
		long elements;
		FMarray_str_to_data_type(list[i].field_type, &elements);
		field_size = list[i].field_size * elements;
	    } else {
		field_size = list[i].field_size;
	    }
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
	i++;
    }
    return struct_size;
}